

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * get_METAL_varname(Context *ctx,RegisterType rt,int regnum)

{
  char *pcVar1;
  char local_58 [8];
  char buf [64];
  int regnum_local;
  RegisterType rt_local;
  Context *ctx_local;
  
  buf._56_4_ = regnum;
  buf._60_4_ = rt;
  get_METAL_varname_in_buf(ctx,rt,regnum,local_58,0x40);
  pcVar1 = StrDup(ctx,local_58);
  return pcVar1;
}

Assistant:

static const char *get_METAL_varname(Context *ctx, RegisterType rt, int regnum)
{
    char buf[64];
    get_METAL_varname_in_buf(ctx, rt, regnum, buf, sizeof (buf));
    return StrDup(ctx, buf);
}